

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1510f4::preprocessor<baryonyx::problem>::constraints_exclude_copy
          (preprocessor<baryonyx::problem> *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping,
          vector<int,_std::allocator<int>_> *constraints_size,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *constraints,
          vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *copy)

{
  pointer *ppcVar1;
  int *piVar2;
  size_t *psVar3;
  double *__args_1;
  iterator __position;
  pointer pcVar4;
  pointer piVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  function_element *elem;
  int *__args;
  ulong uVar9;
  
  uVar8 = ((long)(constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if ((int)uVar8 != 0) {
    uVar9 = 0;
    do {
      if (1 < (&((mapping->
                 super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)->first)[uVar9]) {
        __position._M_current =
             (constraints->
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (constraints->
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
          _M_realloc_insert<>(constraints,__position);
        }
        else {
          ((__position._M_current)->elements).
          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->elements).
          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->elements).
          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__position._M_current)->value = 0;
          (__position._M_current)->id = 0;
          ((__position._M_current)->label)._M_len = 0;
          ((__position._M_current)->label)._M_str = (char *)0x0;
          ((__position._M_current)->elements).
          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->elements).
          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ppcVar1 = &(constraints->
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        pcVar4 = (constraints->
                 super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        piVar5 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4[-1].id = piVar5[uVar9 * 0xc + 0xb];
        psVar3 = (size_t *)(piVar5 + uVar9 * 0xc);
        pcVar7 = (char *)psVar3[1];
        pcVar4[-1].label._M_len = *psVar3;
        pcVar4[-1].label._M_str = pcVar7;
        piVar5 = (constraints_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        (constraints->
        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1].value = piVar5[uVar9 * 0xc + 10];
        piVar6 = *(int **)(piVar5 + uVar9 * 0xc + 6);
        for (__args = *(int **)(piVar5 + uVar9 * 0xc + 4); __args != piVar6; __args = __args + 2) {
          __args_1 = &(this->ctx->parameters).time_limit + __args[1];
          if (*(int *)__args_1 < 0) {
            if (*(char *)((long)__args_1 + 4) == '\x01') {
              piVar2 = &(constraints->
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        )._M_impl.super__Vector_impl_data._M_finish[-1].value;
              *piVar2 = *piVar2 - *__args;
            }
          }
          else {
            std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
            emplace_back<int_const&,int_const&>
                      ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                        *)&(constraints->
                           super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                           )._M_impl.super__Vector_impl_data._M_finish[-1].elements,__args,
                       (int *)__args_1);
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar8 & 0xffffffff));
  }
  return;
}

Assistant:

void constraints_exclude_copy(
      const std::vector<std::pair<int, bool>>& mapping,
      const std::vector<int>& constraints_size,
      const std::vector<bx::constraint>& constraints,
      std::vector<bx::constraint>& copy) const
    {
        for (int i = 0, e = bx::length(constraints); i != e; ++i) {

            // Remaining constraints with one element are undecidable (can be 0
            // or 1) but useless in constraints (e.g. x <= 1) list. We remove
            // it.

            if (constraints_size[i] <= 1)
                continue;

            copy.emplace_back();
            copy.back().id = constraints[i].id;
            copy.back().label = constraints[i].label;
            copy.back().value = constraints[i].value;

            for (const auto& elem : constraints[i].elements) {
                if (mapping[elem.variable_index].first >= 0) {
                    copy.back().elements.emplace_back(
                      elem.factor, mapping[elem.variable_index].first);
                } else {
                    if (mapping[elem.variable_index].second == true) {
                        copy.back().value -= elem.factor;
                    }
                }
            }
        }
    }